

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitSIMDLoad(FunctionValidator *this,SIMDLoad *curr)

{
  Index bytes;
  Memory *pMVar1;
  Type right;
  Type TVar2;
  
  pMVar1 = Module::getMemoryOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->memory).super_IString.str);
  shouldBeTrue<wasm::SIMDLoad*>
            (this,pMVar1 != (Memory *)0x0,curr,"memory.SIMDLoad memory must exist");
  shouldBeTrue<wasm::SIMDLoad*>
            (this,SUB41(((((this->
                           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                           ).
                           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                           .
                           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                          .currModule)->features).features & 8) >> 3,0),curr,
             "SIMD operations require SIMD [--enable-simd]");
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoad*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)34>).super_Expression.
                        type.id,(Type)0x6,curr,"load_splat must have type v128");
  TVar2.id = (curr->ptr->type).id;
  right = indexType(this,(Name)(curr->memory).super_IString.str);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoad*,wasm::Type>
            (this,TVar2,right,curr,"load_splat address must match memory index type");
  if ((ulong)curr->op < 0xc) {
    TVar2.id = *(uintptr_t *)(&DAT_00bea288 + (ulong)curr->op * 8);
  }
  else {
    TVar2.id = 0;
  }
  bytes = SIMDLoad::getMemBytes(curr);
  validateAlignment(this,(curr->align).addr,TVar2,bytes,false,(Expression *)curr);
  return;
}

Assistant:

void FunctionValidator::visitSIMDLoad(SIMDLoad* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.SIMDLoad memory must exist");
  shouldBeTrue(getModule()->features.hasSIMD(),
               curr,
               "SIMD operations require SIMD [--enable-simd]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::v128), curr, "load_splat must have type v128");
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    indexType(curr->memory),
    curr,
    "load_splat address must match memory index type");
  Type memAlignType = Type::none;
  switch (curr->op) {
    case Load8SplatVec128:
    case Load16SplatVec128:
    case Load32SplatVec128:
    case Load32ZeroVec128:
      memAlignType = Type::i32;
      break;
    case Load64SplatVec128:
    case Load8x8SVec128:
    case Load8x8UVec128:
    case Load16x4SVec128:
    case Load16x4UVec128:
    case Load32x2SVec128:
    case Load32x2UVec128:
    case Load64ZeroVec128:
      memAlignType = Type::i64;
      break;
  }
  Index bytes = curr->getMemBytes();
  validateAlignment(curr->align, memAlignType, bytes, /*isAtomic=*/false, curr);
}